

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readRequestAllowingConnect(HttpInputStreamImpl *this)

{
  Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  uint uVar1;
  PromiseArenaMember *node;
  long lVar2;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> coroutine;
  undefined8 in_RSI;
  Fault f;
  undefined1 local_88 [72];
  HttpHeaderTable *pHStack_40;
  
  coroutine._M_fr_ptr = operator_new(0x530);
  *(code **)coroutine._M_fr_ptr = readRequestAllowingConnect;
  *(code **)((long)coroutine._M_fr_ptr + 8) = readRequestAllowingConnect;
  this_00 = (Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *)
            ((long)coroutine._M_fr_ptr + 0x10);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x520) = in_RSI;
  local_88._0_4_ = 0x587dd6;
  local_88._4_4_ = 0;
  local_88._8_4_ = 0x5897f2;
  local_88._12_4_ = 0;
  local_88._16_4_ = 0x593;
  local_88._20_4_ = 0x2c;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da900;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da948;
  location.function = "readRequestAllowingConnect";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x593;
  location.columnNumber = 0x2c;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  this_01 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x518);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006da900;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006da948;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  readRequestHeaders(this_01);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
        *)((long)coroutine._M_fr_ptr + 0x270);
  co_await<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
              *)this_01);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x528) = 0;
  bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar3) {
    kj::_::
    PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::await_resume((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                    *)((long)coroutine._M_fr_ptr + 0x468),__return_storage_ptr__);
    if ((*(char *)((long)coroutine._M_fr_ptr + 0x420) == '\x01') &&
       (*(int *)((long)coroutine._M_fr_ptr + 0x428) - 1U < 3)) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x428) = 0;
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 0x288) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x290));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    node = (PromiseArenaMember *)(this_01->super_HttpInputStream)._vptr_HttpInputStream;
    if (node != (PromiseArenaMember *)0x0) {
      (this_01->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose(node);
    }
    uVar1 = ((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
              *)((long)coroutine._M_fr_ptr + 0x468))->tag;
    if (uVar1 == 1) {
      lVar2 = *(long *)((long)coroutine._M_fr_ptr + 0x520);
      local_88._48_4_ = 1;
      local_88._56_4_ = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x470);
      getEntityBody((HttpInputStreamImpl *)(local_88 + 0x40),(RequestOrResponse)lVar2,
                    (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0,(int)local_88 + 0x30,
                    (HttpHeaders *)0x0);
      local_88._48_4_ = 0;
      local_88._4_4_ = (undefined4)*(undefined8 *)((long)coroutine._M_fr_ptr + 0x478);
      local_88._8_4_ =
           (undefined4)((ulong)*(undefined8 *)((long)coroutine._M_fr_ptr + 0x478) >> 0x20);
      local_88._12_4_ = (undefined4)*(undefined8 *)((long)coroutine._M_fr_ptr + 0x480);
      local_88._16_4_ =
           (undefined4)((ulong)*(undefined8 *)((long)coroutine._M_fr_ptr + 0x480) >> 0x20);
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x4a8) = 1;
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x4b0) =
           *(undefined4 *)((long)coroutine._M_fr_ptr + 0x470);
      *(ulong *)((long)coroutine._M_fr_ptr + 0x4b4) = CONCAT44(local_88._4_4_,local_88._0_4_);
      *(ulong *)((long)coroutine._M_fr_ptr + 0x4bc) = CONCAT44(local_88._12_4_,local_88._8_4_);
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x4c4) = local_88._16_4_;
      *(long *)((long)coroutine._M_fr_ptr + 0x4c8) = lVar2 + 0x48;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d0) = local_88._64_8_;
      *(HttpHeaderTable **)((long)coroutine._M_fr_ptr + 0x4d8) = pHStack_40;
      kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
      fulfill(this_00,(OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *)
                      ((long)coroutine._M_fr_ptr + 0x4a8));
      OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::destroy
                ((OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *)
                 ((long)coroutine._M_fr_ptr + 0x4a8));
    }
    else {
      if (uVar1 != 2) {
        if (uVar1 == 3) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[12]>
                    ((Fault *)local_88,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0x59f,FAILED,(char *)0x0,"\"bad request\"",(char (*) [12])"bad request");
          kj::_::Debug::Fault::fatal((Fault *)local_88);
        }
        kj::_::unreachable();
      }
      lVar2 = *(long *)((long)coroutine._M_fr_ptr + 0x520);
      local_88._32_4_ = 2;
      getEntityBody((HttpInputStreamImpl *)local_88,(RequestOrResponse)lVar2,
                    (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0,(int)local_88 + 0x20,
                    (HttpHeaders *)0x0);
      local_88._32_4_ = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4e8) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x470);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4f0) =
           *(undefined8 *)((long)coroutine._M_fr_ptr + 0x478);
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x4e0) = 2;
      *(long *)((long)coroutine._M_fr_ptr + 0x4f8) = lVar2 + 0x48;
      *(ulong *)((long)coroutine._M_fr_ptr + 0x500) = CONCAT44(local_88._4_4_,local_88._0_4_);
      *(ulong *)((long)coroutine._M_fr_ptr + 0x508) = CONCAT44(local_88._12_4_,local_88._8_4_);
      kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
      fulfill(this_00,(OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *)
                      ((long)coroutine._M_fr_ptr + 0x4e0));
      OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::destroy
                ((OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *)
                 ((long)coroutine._M_fr_ptr + 0x4e0));
    }
    *(undefined8 *)coroutine._M_fr_ptr = 0;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x528) = 1;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::OneOf<Request, Connect>> readRequestAllowingConnect() override {
    auto requestOrProtocolError = co_await readRequestHeaders();
    KJ_SWITCH_ONEOF(requestOrProtocolError) {
      KJ_CASE_ONEOF(request, HttpHeaders::Request) {
        auto body = getEntityBody(HttpInputStreamImpl::REQUEST, request.method, 0, headers);
        co_return HttpInputStream::Request { request.method, request.url, headers, kj::mv(body) };
      }
      KJ_CASE_ONEOF(request, HttpHeaders::ConnectRequest) {
        auto body = getEntityBody(HttpInputStreamImpl::REQUEST, HttpConnectMethod(), 0, headers);
        co_return HttpInputStream::Connect { request.authority, headers, kj::mv(body) };
      }
      KJ_CASE_ONEOF(error, HttpHeaders::ProtocolError) {
        KJ_FAIL_REQUIRE("bad request");
      }
    }
    KJ_UNREACHABLE;
  }